

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::iterate
          (GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  GLenum gs_input_primitive_type;
  long lVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  long lVar5;
  char *pcVar6;
  bool *pbVar7;
  bool bVar8;
  bool has_vs_compiled;
  bool has_gs_compiled;
  bool has_fs_compiled;
  GLint link_status;
  bool local_1e3;
  bool local_1e2;
  bool local_1e1;
  uint local_1e0;
  int local_1dc;
  string local_1d8;
  long local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    local_1e0 = (uint)CONCAT71((int7)((ulong)local_1b8 >> 8),1);
    lVar5 = 0;
    do {
      gs_input_primitive_type = *(GLenum *)((long)&DAT_01b43400 + lVar5);
      deinitSOs(this);
      local_1e1 = false;
      local_1e2 = false;
      local_1e3 = false;
      initShaderObjects(this,gs_input_primitive_type,&local_1e1,&local_1e2,&local_1e3);
      lVar1 = local_1b8;
      bVar8 = local_1e1;
      if (((local_1e1 == true) && (local_1e2 == true)) && (local_1e3 != false)) {
        GVar3 = (**(code **)(local_1b8 + 0x3c8))();
        this->m_po_id = GVar3;
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glCreateProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x343);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_fs_id);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_gs_id);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_vs_id);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glAttachShader() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x349);
        (**(code **)(lVar1 + 0xce8))(this->m_po_id);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x34d);
        local_1dc = 0;
        (**(code **)(lVar1 + 0x9d8))(this->m_po_id,0x8b82,&local_1dc);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glGetProgramiv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x353);
        if (local_1dc == 1) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"A PO using a malformed GS has linked successfully. ",0x33
                    );
          pcVar6 = "Test input primitive type: ";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Test input primitive type: ",0x1b);
          getInputPrimitiveTypeQualifier_abi_cxx11_
                    (&local_1d8,(GeometryShaderInvalidArrayedInputVariablesTest *)pcVar6,
                     gs_input_primitive_type);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          local_1e0 = 0;
        }
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "One of the shaders failed to compile (but shouldn\'t have). Shaders that failed to compile:"
                   ,0x5a);
        pcVar6 = "FS ";
        if (bVar8 != false) {
          pcVar6 = fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar6,(ulong)(bVar8 ^ 1) * 3);
        pcVar6 = "GS ";
        if ((ulong)local_1e2 != 0) {
          pcVar6 = fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar6,((ulong)local_1e2 ^ 1) * 3);
        pbVar7 = (bool *)0x1a67c05;
        if (local_1e3 != false) {
          pbVar7 = fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pbVar7,(ulong)((local_1e3 ^ 1) * 2));
        pcVar6 = ". Input primitive type: [";
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,". Input primitive type: [",0x19);
        getInputPrimitiveTypeQualifier_abi_cxx11_
                  (&local_1d8,(GeometryShaderInvalidArrayedInputVariablesTest *)pcVar6,
                   gs_input_primitive_type);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x14);
    bVar8 = (local_1e0 & 1) == 0;
    if (bVar8) {
      pcVar6 = "Fail";
    }
    else {
      pcVar6 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar8,pcVar6
              );
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
             ,0x31e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInvalidArrayedInputVariablesTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Iterate over all valid input primitive types */
	const glw::GLenum input_primitive_types[] = { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
												  GL_TRIANGLES_ADJACENCY };
	const unsigned int n_input_primitive_types = sizeof(input_primitive_types) / sizeof(input_primitive_types[0]);

	for (unsigned int n_input_primitive_type = 0; n_input_primitive_type < n_input_primitive_types;
		 ++n_input_primitive_type)
	{
		const glw::GLenum input_primitive_type = input_primitive_types[n_input_primitive_type];

		/* Release shader objects initialized in previous iterations */
		deinitSOs();

		/* Set up shader objects */
		bool has_fs_compiled = false;
		bool has_gs_compiled = false;
		bool has_vs_compiled = false;

		initShaderObjects(input_primitive_type, &has_fs_compiled, &has_gs_compiled, &has_vs_compiled);

		if (!has_fs_compiled || !has_gs_compiled || !has_vs_compiled)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "One of the shaders failed to compile (but shouldn't have). Shaders that failed to compile:"
				<< ((!has_fs_compiled) ? "FS " : "") << ((!has_gs_compiled) ? "GS " : "")
				<< ((!has_vs_compiled) ? "VS" : "") << ". Input primitive type: ["
				<< getInputPrimitiveTypeQualifier(input_primitive_type) << "]" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		gl.attachShader(m_po_id, m_fs_id);
		gl.attachShader(m_po_id, m_gs_id);
		gl.attachShader(m_po_id, m_vs_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A PO using a malformed GS has linked successfully. "
							   << "Test input primitive type: " << getInputPrimitiveTypeQualifier(input_primitive_type)
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all input primitive types) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}